

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

bool __thiscall nvim::Nvim::buf_is_loaded(Nvim *this,Buffer buffer)

{
  bool res;
  bool local_42;
  allocator local_41;
  Buffer local_40;
  string local_38;
  
  local_40 = buffer;
  std::__cxx11::string::string((string *)&local_38,"nvim_buf_is_loaded",&local_41);
  NvimRPC::call<bool,long>(&this->client_,&local_38,&local_42,&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return local_42;
}

Assistant:

bool Nvim::buf_is_loaded(Buffer buffer) {
    bool res;
    client_.call("nvim_buf_is_loaded", res, buffer);
    return res;
}